

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void psr_new_local(Parser *psr,uint64_t name)

{
  int iVar1;
  Local *pLVar2;
  
  iVar1 = psr->locals_capacity;
  if (iVar1 <= psr->locals_count) {
    psr->locals_capacity = iVar1 * 2;
    pLVar2 = (Local *)realloc(psr->locals,(long)iVar1 << 4);
    psr->locals = pLVar2;
  }
  iVar1 = psr->locals_count;
  psr->locals_count = iVar1 + 1;
  psr->locals[iVar1].name = name;
  return;
}

Assistant:

static void psr_new_local(Parser *psr, uint64_t name) {
	if (psr->locals_count >= psr->locals_capacity) {
		psr->locals_capacity *= 2;
		psr->locals = realloc(psr->locals, sizeof(Local) * psr->locals_capacity);
	}
	psr->locals[psr->locals_count++].name = name;
}